

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gateway.cc
# Opt level: O3

future<int> __thiscall prometheus::Gateway::AsyncDelete(Gateway *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Result<int> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined8 in_RSI;
  _State_baseV2 *__tmp;
  future<int> fVar3;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  long *local_50;
  __state_type local_48;
  _func_int **local_38 [2];
  
  local_48.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_48.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00123840;
  p_Var1[1]._M_use_count = 0;
  p_Var1[1]._M_weak_count = 0;
  *(undefined4 *)&p_Var1[2]._vptr__Sp_counted_base = 0;
  *(undefined1 *)((long)&p_Var1[2]._vptr__Sp_counted_base + 4) = 0;
  p_Var1[2]._M_use_count = 0;
  p_Var1[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[3]._M_use_count = 0;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00123890;
  this_00 = (_Result<int> *)operator_new(0x18);
  ::std::__future_base::_Result<int>::_Result(this_00);
  p_Var1[4]._vptr__Sp_counted_base = (_func_int **)this_00;
  p_Var1[4]._M_use_count = (int)in_RSI;
  p_Var1[4]._M_weak_count = (int)((ulong)in_RSI >> 0x20);
  local_38[0] = (_func_int **)0x0;
  local_50 = (long *)operator_new(0x20);
  *local_50 = (long)&PTR___State_001238e8;
  local_50[1] = (long)(p_Var1 + 1);
  local_50[2] = (long)::std::__future_base::
                      _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/push/src/gateway.cc:194:41)>_>,_int>
                      ::_M_run;
  local_50[3] = 0;
  ::std::thread::_M_start_thread(local_38,&local_50,0);
  if (local_50 != (long *)0x0) {
    (**(code **)(*local_50 + 8))();
  }
  if (p_Var1[3]._vptr__Sp_counted_base == (_func_int **)0x0) {
    p_Var1[3]._vptr__Sp_counted_base = local_38[0];
    local_48.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)(p_Var1 + 1);
    local_48.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var1;
    ::std::__basic_future<int>::__basic_future((__basic_future<int> *)this,&local_48);
    _Var2._M_pi = extraout_RDX;
    if (local_48.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var2._M_pi = extraout_RDX_00;
    }
    fVar3.super___basic_future<int>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Var2._M_pi;
    fVar3.super___basic_future<int>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (future<int>)
           fVar3.super___basic_future<int>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>;
  }
  ::std::terminate();
}

Assistant:

std::future<int> Gateway::AsyncDelete() {
  return std::async(std::launch::async, [&] { return Delete(); });
}